

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEFetchRow<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  undefined8 uVar2;
  unsigned_long skip_count;
  data_ptr_t pdVar3;
  RLEScanState<duckdb::uhugeint_t> scan_state;
  RLEScanState<duckdb::uhugeint_t> RStack_68;
  
  RLEScanState<duckdb::uhugeint_t>::RLEScanState(&RStack_68,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  RLEScanState<duckdb::uhugeint_t>::Skip(&RStack_68,segment,skip_count);
  pdVar3 = BufferHandle::Ptr(&RStack_68.handle);
  pdVar1 = result->data;
  uVar2 = *(undefined8 *)(pdVar3 + RStack_68.entry_pos * 0x10 + 8 + segment->offset + 8);
  *(undefined8 *)(pdVar1 + result_idx * 0x10) =
       *(undefined8 *)(pdVar3 + RStack_68.entry_pos * 0x10 + 8 + segment->offset);
  *(undefined8 *)(pdVar1 + result_idx * 0x10 + 8) = uVar2;
  RLEScanState<duckdb::uhugeint_t>::~RLEScanState(&RStack_68);
  return;
}

Assistant:

void RLEFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	RLEScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto result_data = FlatVector::GetData<T>(result);
	result_data[result_idx] = data_pointer[scan_state.entry_pos];
}